

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcut.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c1ed::BinaryCut<unsigned_long>::Run
          (BinaryCut<unsigned_long> *this,istream *input_stream)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int block_index;
  int iVar4;
  allocator_type local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> data;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&data,(long)this->block_length_,&local_49);
  iVar3 = -1;
  do {
    iVar4 = this->start_number_;
    iVar3 = iVar3 + 1;
    if (iVar4 <= iVar3) {
      goto LAB_00104d84;
    }
    bVar1 = sptk::ReadStream<unsigned_long>
                      (false,0,0,this->block_length_,&data,input_stream,(int *)0x0);
  } while (bVar1);
  goto LAB_00104dd4;
  while( true ) {
    bVar1 = sptk::WriteStream<unsigned_long>
                      (0,this->block_length_,&data,(ostream *)&std::cout,(int *)0x0);
    iVar4 = iVar4 + 1;
    if (!bVar1) break;
LAB_00104d84:
    bVar1 = true;
    if ((this->end_number_ != -1 && this->end_number_ < iVar4) ||
       (bVar2 = sptk::ReadStream<unsigned_long>
                          (false,0,0,this->block_length_,&data,input_stream,(int *)0x0), !bVar2))
    goto LAB_00104dd6;
  }
LAB_00104dd4:
  bVar1 = false;
LAB_00104dd6:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return bVar1;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    std::vector<T> data(block_length_);

    // Skip data.
    for (int block_index(0); block_index < start_number_; ++block_index) {
      if (!sptk::ReadStream(false, 0, 0, block_length_, &data, input_stream,
                            NULL)) {
        return false;
      }
    }

    // Write data.
    for (int block_index(start_number_);
         ((kMagicNumberForEndOfFile == end_number_ ||
           block_index <= end_number_) &&
          sptk::ReadStream(false, 0, 0, block_length_, &data, input_stream,
                           NULL));
         ++block_index) {
      if (!sptk::WriteStream(0, block_length_, data, &std::cout, NULL)) {
        return false;
      }
    }

    return true;
  }